

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseElementStart(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlDocPtr doc;
  xmlChar *pxVar2;
  _xmlSAXHandler *p_Var3;
  int nr;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  uint uVar6;
  xmlChar *value;
  int iVar7;
  _xmlNode *p_Var8;
  int nbNs;
  xmlChar *URI;
  xmlChar *prefix;
  _xmlNode *local_60;
  xmlParserNodeInfo local_58;
  
  iVar7 = 0x800;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    iVar7 = 0x100;
  }
  prefix = (xmlChar *)0x0;
  URI = (xmlChar *)0x0;
  nbNs = 0;
  if (iVar7 < ctxt->nameNr) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_RESOURCE_LIMIT,
                      "Excessive depth in document: %d use XML_PARSE_HUGE option\n",ctxt->nameNr);
    xmlHaltParser(ctxt);
  }
  else {
    if (ctxt->record_info != 0) {
      pxVar1 = ctxt->input;
      local_58.begin_pos = (unsigned_long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
      local_58.begin_line = (unsigned_long)pxVar1->line;
    }
    if (ctxt->spaceNr == 0) {
      iVar7 = -1;
    }
    else {
      iVar7 = -1;
      if (*ctxt->space != -2) {
        iVar7 = *ctxt->space;
      }
    }
    spacePush(ctxt,iVar7);
    iVar7 = ctxt->input->line;
    if (ctxt->sax2 == 0) {
      value = xmlParseStartTag(ctxt);
    }
    else {
      value = xmlParseStartTag2(ctxt,&prefix,&URI,&nbNs);
    }
    pxVar5 = prefix;
    pxVar4 = URI;
    nr = nbNs;
    if (value != (xmlChar *)0x0) {
      nameNsPush(ctxt,value,prefix,URI,iVar7,nbNs);
      p_Var8 = ctxt->node;
      if ((((ctxt->validate != 0) && (ctxt->wellFormed != 0)) &&
          (doc = ctxt->myDoc, p_Var8 != (_xmlNode *)0x0 && doc != (xmlDocPtr)0x0)) &&
         (p_Var8 == doc->children)) {
        local_60 = p_Var8;
        uVar6 = xmlValidateRoot(&ctxt->vctxt,doc);
        ctxt->valid = ctxt->valid & uVar6;
        p_Var8 = local_60;
      }
      pxVar1 = ctxt->input;
      pxVar2 = pxVar1->cur;
      if (*pxVar2 == '>') {
        pxVar1->col = pxVar1->col + 1;
        pxVar1->cur = pxVar2 + 1;
        if (pxVar2[1] == '\0') {
          xmlParserGrow(ctxt);
        }
        iVar7 = 0;
        if (p_Var8 == (_xmlNode *)0x0) {
          return 0;
        }
        if (ctxt->record_info == 0) {
          return 0;
        }
        local_58.end_pos = 0;
        local_58.end_line = 0;
      }
      else {
        if ((*pxVar2 != '/') || (pxVar2[1] != '>')) {
          xmlFatalErrMsgStrIntStr
                    (ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s line %d\n",value,
                     iVar7,(xmlChar *)0x0);
          nodePop(ctxt);
          namePop(ctxt);
          spacePop(ctxt);
          if (nr < 1) {
            return -1;
          }
          xmlParserNsPop(ctxt,nr);
          return -1;
        }
        pxVar1->cur = pxVar2 + 2;
        pxVar1->col = pxVar1->col + 2;
        if (pxVar2[2] == '\0') {
          xmlParserGrow(ctxt);
        }
        p_Var3 = ctxt->sax;
        if (ctxt->sax2 == 0) {
          if (((p_Var3 != (_xmlSAXHandler *)0x0) && (p_Var3->endElement != (endElementSAXFunc)0x0))
             && (ctxt->disableSAX == 0)) {
            (*p_Var3->endElement)(ctxt->userData,value);
          }
        }
        else if (((p_Var3 != (_xmlSAXHandler *)0x0) &&
                 (p_Var3->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0)) {
          (*p_Var3->endElementNs)(ctxt->userData,value,pxVar5,pxVar4);
        }
        namePop(ctxt);
        spacePop(ctxt);
        if (0 < nr) {
          xmlParserNsPop(ctxt,nr);
        }
        iVar7 = 1;
        if (p_Var8 == (_xmlNode *)0x0) {
          return 1;
        }
        if (ctxt->record_info == 0) {
          return 1;
        }
        pxVar1 = ctxt->input;
        local_58.end_pos = (unsigned_long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
        local_58.end_line = (unsigned_long)pxVar1->line;
      }
      local_58.node = p_Var8;
      xmlParserAddNodeInfo(ctxt,&local_58);
      return iVar7;
    }
    spacePop(ctxt);
  }
  return -1;
}

Assistant:

static int
xmlParseElementStart(xmlParserCtxtPtr ctxt) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 2048 : 256;
    const xmlChar *name;
    const xmlChar *prefix = NULL;
    const xmlChar *URI = NULL;
    xmlParserNodeInfo node_info;
    int line;
    xmlNodePtr cur;
    int nbNs = 0;

    if (ctxt->nameNr > maxDepth) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_RESOURCE_LIMIT,
                "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                ctxt->nameNr);
	xmlHaltParser(ctxt);
	return(-1);
    }

    /* Capture start position */
    if (ctxt->record_info) {
        node_info.begin_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
	node_info.begin_line = ctxt->input->line;
    }

    if (ctxt->spaceNr == 0)
	spacePush(ctxt, -1);
    else if (*ctxt->space == -2)
	spacePush(ctxt, -1);
    else
	spacePush(ctxt, *ctxt->space);

    line = ctxt->input->line;
#ifdef LIBXML_SAX1_ENABLED
    if (ctxt->sax2)
#endif /* LIBXML_SAX1_ENABLED */
        name = xmlParseStartTag2(ctxt, &prefix, &URI, &nbNs);
#ifdef LIBXML_SAX1_ENABLED
    else
	name = xmlParseStartTag(ctxt);
#endif /* LIBXML_SAX1_ENABLED */
    if (name == NULL) {
	spacePop(ctxt);
        return(-1);
    }
    nameNsPush(ctxt, name, prefix, URI, line, nbNs);
    cur = ctxt->node;

#ifdef LIBXML_VALID_ENABLED
    /*
     * [ VC: Root Element Type ]
     * The Name in the document type declaration must match the element
     * type of the root element.
     */
    if (ctxt->validate && ctxt->wellFormed && ctxt->myDoc &&
        ctxt->node && (ctxt->node == ctxt->myDoc->children))
        ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check for an Empty Element.
     */
    if ((RAW == '/') && (NXT(1) == '>')) {
        SKIP(2);
	if (ctxt->sax2) {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElementNs(ctxt->userData, name, prefix, URI);
#ifdef LIBXML_SAX1_ENABLED
	} else {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElement(ctxt->userData, name);
#endif /* LIBXML_SAX1_ENABLED */
	}
	namePop(ctxt);
	spacePop(ctxt);
	if (nbNs > 0)
	    xmlParserNsPop(ctxt, nbNs);
	if (cur != NULL && ctxt->record_info) {
            node_info.node = cur;
            node_info.end_pos = ctxt->input->consumed +
                                (CUR_PTR - ctxt->input->base);
            node_info.end_line = ctxt->input->line;
            xmlParserAddNodeInfo(ctxt, &node_info);
	}
	return(1);
    }
    if (RAW == '>') {
        NEXT1;
        if (cur != NULL && ctxt->record_info) {
            node_info.node = cur;
            node_info.end_pos = 0;
            node_info.end_line = 0;
            xmlParserAddNodeInfo(ctxt, &node_info);
        }
    } else {
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_GT_REQUIRED,
		     "Couldn't find end of Start Tag %s line %d\n",
		                name, line, NULL);

	/*
	 * end of parsing of this node.
	 */
	nodePop(ctxt);
	namePop(ctxt);
	spacePop(ctxt);
	if (nbNs > 0)
	    xmlParserNsPop(ctxt, nbNs);
	return(-1);
    }

    return(0);
}